

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int mbedtls_x509_crt_check_extended_key_usage
              (mbedtls_x509_crt *crt,char *usage_oid,size_t usage_len)

{
  int iVar1;
  bool bVar2;
  mbedtls_x509_buf *cur_oid;
  mbedtls_x509_sequence *cur;
  size_t usage_len_local;
  char *usage_oid_local;
  mbedtls_x509_crt *crt_local;
  
  if ((crt->ext_types & 0x800U) == 0) {
    crt_local._4_4_ = 0;
  }
  else {
    for (cur_oid = &(crt->ext_key_usage).buf; cur_oid != (mbedtls_x509_buf *)0x0;
        cur_oid = *(mbedtls_x509_buf **)(cur_oid + 1)) {
      if ((cur_oid->len == usage_len) &&
         (iVar1 = memcmp(cur_oid->p,usage_oid,usage_len), iVar1 == 0)) {
        return 0;
      }
      bVar2 = true;
      if (cur_oid->len == 4) {
        iVar1 = memcmp("U\x1d%",cur_oid->p,cur_oid->len);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) {
        return 0;
      }
    }
    crt_local._4_4_ = -0x2800;
  }
  return crt_local._4_4_;
}

Assistant:

int mbedtls_x509_crt_check_extended_key_usage(const mbedtls_x509_crt *crt,
                                              const char *usage_oid,
                                              size_t usage_len)
{
    const mbedtls_x509_sequence *cur;

    /* Extension is not mandatory, absent means no restriction */
    if ((crt->ext_types & MBEDTLS_X509_EXT_EXTENDED_KEY_USAGE) == 0) {
        return 0;
    }

    /*
     * Look for the requested usage (or wildcard ANY) in our list
     */
    for (cur = &crt->ext_key_usage; cur != NULL; cur = cur->next) {
        const mbedtls_x509_buf *cur_oid = &cur->buf;

        if (cur_oid->len == usage_len &&
            memcmp(cur_oid->p, usage_oid, usage_len) == 0) {
            return 0;
        }

        if (MBEDTLS_OID_CMP(MBEDTLS_OID_ANY_EXTENDED_KEY_USAGE, cur_oid) == 0) {
            return 0;
        }
    }

    return MBEDTLS_ERR_X509_BAD_INPUT_DATA;
}